

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

int Ivy_FastMapCutCost(Ivy_Man_t *pAig,Vec_Ptr_t *vFront)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)vFront->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(*(int *)(*(long *)((long)pAig->pData + 0x10) + 4 +
                                     (long)*vFront->pArray[lVar2] *
                                     (long)*(int *)((long)pAig->pData + 8)) == 0);
      lVar2 = lVar2 + 1;
    } while (vFront->nSize != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Ivy_FastMapCutCost( Ivy_Man_t * pAig, Vec_Ptr_t * vFront )
{
    Ivy_Supp_t * pSuppF;
    Ivy_Obj_t * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pFanin, i )
    {
        pSuppF = Ivy_ObjSupp( pAig, pFanin );
        if ( pSuppF->nRefs == 0 )
            Counter++;
    }
    return Counter;
}